

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  BYTE *iend_00;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff84;
  ZSTD_strategy in_stack_ffffffffffffff88;
  U32 local_6c;
  BYTE *iend;
  BYTE *ip;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_matchState_t *ms_local;
  
  iend_00 = (BYTE *)((long)src + srcSize);
  ZSTD_window_update(&ms->window,src,srcSize);
  if (params->forceWindow == 0) {
    local_6c = (int)iend_00 - (int)(ms->window).base;
  }
  else {
    local_6c = 0;
  }
  ms->loadedDictEnd = local_6c;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).minMatch;
  uVar5 = (params->cParams).targetLength;
  uVar6 = (params->cParams).strategy;
  cParams1.minMatch = uVar6;
  cParams1.searchLog = uVar5;
  cParams1.hashLog = uVar4;
  cParams1.chainLog = uVar3;
  cParams1.windowLog = uVar2;
  uVar1 = (ms->cParams).windowLog;
  uVar7 = (ms->cParams).hashLog;
  uVar8 = (ms->cParams).searchLog;
  uVar9 = (ms->cParams).minMatch;
  uVar10 = (ms->cParams).targetLength;
  uVar11 = (ms->cParams).strategy;
  cParams2.minMatch = uVar11;
  cParams2.searchLog = uVar10;
  cParams2.hashLog = uVar9;
  cParams2.chainLog = uVar8;
  cParams2.windowLog = uVar7;
  cParams1.targetLength = in_stack_ffffffffffffff64;
  cParams1.strategy = uVar1;
  cParams2.targetLength = in_stack_ffffffffffffff84;
  cParams2.strategy = in_stack_ffffffffffffff88;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (8 < srcSize) {
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend_00,dtlm);
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend_00,dtlm);
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (7 < srcSize) {
        ZSTD_insertAndFindFirstIndex(ms,iend_00 + -8);
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      if (7 < srcSize) {
        ZSTD_updateTree(ms,iend_00 + -8,iend_00);
      }
    }
    ms->nextToUpdate = (int)iend_00 - (int)(ms->window).base;
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}